

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O1

void GenCodeCmdCombinedd(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  uint uVar1;
  x86Argument arg;
  x86Argument arg_00;
  ulong uVar2;
  uint shift;
  undefined4 uStack_8c;
  undefined4 uStack_84;
  undefined4 uStack_6c;
  undefined4 uStack_64;
  x86Argument local_50;
  
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uint)((ulong)cmd >> 0xd) & 0x7f8);
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEDX,sDWORD,rEBX,(uint)((ulong)cmd >> 0x15) & 0x7f8);
  uVar1 = (uint)((ulong)cmd >> 5);
  shift = uVar1 & 0x7f8;
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,shift,rEAX);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,shift | 4,rEDX);
  local_50.type = argPtr;
  local_50.field_1.reg = rECX;
  local_50.ptrBase = rEBX;
  local_50.ptrIndex = rNONE;
  local_50.ptrMult = 1;
  local_50.ptrNum = shift;
  CodeGenGenericContext::MemInvalidate(&ctx->ctx,&local_50);
  arg._4_4_ = uStack_6c;
  arg.type = 4;
  arg.field_1.imm64Arg._4_4_ = uStack_64;
  arg.field_1.reg = 3;
  uVar2 = CONCAT44(uVar1,1) & 0x7f8ffffffff;
  arg.ptrBase = rEBX;
  arg.ptrIndex = rNONE;
  arg.ptrMult = (int)uVar2;
  arg.ptrNum = (int)(uVar2 >> 0x20);
  CodeGenGenericContext::InvalidateAddressValue(&ctx->ctx,arg);
  local_50.type = argPtr;
  local_50.field_1.reg = rECX;
  local_50.ptrBase = rEBX;
  local_50.ptrIndex = rNONE;
  local_50.ptrMult = 1;
  local_50.ptrNum = shift | 4;
  CodeGenGenericContext::MemInvalidate(&ctx->ctx,&local_50);
  arg_00._4_4_ = uStack_8c;
  arg_00.type = 4;
  arg_00.field_1.imm64Arg._4_4_ = uStack_84;
  arg_00.field_1.reg = 3;
  uVar2 = CONCAT44(shift,1) | 0x400000000;
  arg_00.ptrBase = rEBX;
  arg_00.ptrIndex = rNONE;
  arg_00.ptrMult = (int)uVar2;
  arg_00.ptrNum = (int)(uVar2 >> 0x20);
  CodeGenGenericContext::InvalidateAddressValue(&ctx->ctx,arg_00);
  return;
}

Assistant:

void GenCodeCmdCombinedd(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rB * 8); // Load low value
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rC * 8); // Load high value

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Store to target
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8 + 4, rEDX);

#if defined(_M_X64)
	// To avoid partial 'register' reads later
	ctx.ctx.MemInvalidate(x86Argument(sDWORD, rREG, cmd.rA * 8));
	ctx.ctx.InvalidateAddressValue(x86Argument(sDWORD, rREG, cmd.rA * 8));
	ctx.ctx.MemInvalidate(x86Argument(sDWORD, rREG, cmd.rA * 8 + 4));
	ctx.ctx.InvalidateAddressValue(x86Argument(sDWORD, rREG, cmd.rA * 8 + 4));
#endif
}